

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.hpp
# Opt level: O2

void __thiscall
so_5::subscription_bind_t::ensure_handler_can_be_used_with_mbox
          (subscription_bind_t *this,msg_type_and_handler_pair_t *handler)

{
  char *pcVar1;
  int iVar2;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (handler->m_mutability == mutable_message) {
    iVar2 = (*((this->m_mbox_ref).m_obj)->_vptr_abstract_message_box_t[6])();
    if (iVar2 == 0) {
      std::__cxx11::string::string
                ((string *)&local_30,
                 "subscription to mutable message from MPMC mbox is disabled, msg_type=",&local_51);
      pcVar1 = *(char **)((handler->m_msg_type)._M_target + 8);
      std::operator+(&local_50,&local_30,pcVar1 + (*pcVar1 == '*'));
      exception_t::raise(0x2810bd);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  return;
}

Assistant:

inline void
subscription_bind_t::ensure_handler_can_be_used_with_mbox(
	const so_5::details::msg_type_and_handler_pair_t & handler ) const
{
	if( message_mutability_t::mutable_message == handler.m_mutability &&
			mbox_type_t::multi_producer_multi_consumer == m_mbox_ref->type() )
		SO_5_THROW_EXCEPTION( rc_subscription_to_mutable_msg_from_mpmc_mbox,
				std::string( "subscription to mutable message from MPMC mbox "
						"is disabled, msg_type=" )
				+ handler.m_msg_type.name() );
}